

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O3

bool __thiscall
draco::
PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
::ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_5)

{
  CorrType *pCVar1;
  _Type *__s;
  long lVar2;
  ulong __n;
  long lVar3;
  long lVar4;
  Point2 orig;
  undefined1 local_68 [24];
  undefined8 local_50;
  Point2 local_48;
  CorrType *local_40;
  Transform *local_38;
  
  lVar2 = (long)num_components;
  __n = 0xffffffffffffffff;
  if (-1 < num_components) {
    __n = lVar2 * 4;
  }
  local_68._12_4_ = size;
  local_40 = in_corr;
  __s = (_Type *)operator_new__(__n);
  memset(__s,0,__n);
  pCVar1 = local_40;
  local_38 = &(this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
              ).transform_;
  local_48.v_._M_elems = *(array<int,_2UL> *)__s;
  local_50 = *(undefined8 *)local_40;
  local_68._16_8_ = __s;
  PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
            ((PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)local_68,
             (Point2 *)local_38,&local_48);
  *(undefined8 *)out_data = local_68._0_8_;
  if (num_components < (int)local_68._12_4_) {
    lVar3 = (long)(int)local_68._12_4_;
    lVar4 = 0;
    do {
      local_48.v_._M_elems = *(array<int,_2UL> *)(out_data + lVar4);
      local_50 = *(undefined8 *)(pCVar1 + lVar2 + lVar4);
      PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
                ((PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)local_68,
                 (Point2 *)local_38,&local_48);
      *(undefined8 *)(out_data + lVar2 + lVar4) = local_68._0_8_;
      lVar4 = lVar4 + lVar2;
    } while (lVar2 + lVar4 < lVar3);
  }
  operator_delete__((void *)local_68._16_8_);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}